

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_api_json_autogen.h
# Opt level: O1

void __thiscall
cfd::api::json::PsbtScriptData::PsbtScriptData(PsbtScriptData *this,PsbtScriptData *param_1)

{
  pointer pcVar1;
  
  (this->super_JsonClassBase<cfd::api::json::PsbtScriptData>)._vptr_JsonClassBase =
       (_func_int **)&PTR__PsbtScriptData_002b4610;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_Rb_tree(&(this->ignore_items)._M_t,&(param_1->ignore_items)._M_t);
  (this->asm__)._M_dataplus._M_p = (pointer)&(this->asm__).field_2;
  pcVar1 = (param_1->asm__)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->asm__,pcVar1,pcVar1 + (param_1->asm__)._M_string_length);
  (this->hex_)._M_dataplus._M_p = (pointer)&(this->hex_).field_2;
  pcVar1 = (param_1->hex_)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->hex_,pcVar1,pcVar1 + (param_1->hex_)._M_string_length);
  (this->type_)._M_dataplus._M_p = (pointer)&(this->type_).field_2;
  pcVar1 = (param_1->type_)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->type_,pcVar1,pcVar1 + (param_1->type_)._M_string_length);
  return;
}

Assistant:

PsbtScriptData() {
    CollectFieldName();
  }